

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O1

size_t x86_code(lzma_simple *simple,uint32_t now_pos,_Bool is_encoder,uint8_t *buffer,size_t size)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  
  if (size < 5) {
    sVar3 = 0;
  }
  else {
    uVar10 = simple->prev_mask;
    uVar9 = now_pos - 5;
    if (now_pos - simple->prev_pos < 6) {
      uVar9 = simple->prev_pos;
    }
    sVar3 = 0;
    do {
      if ((byte)(buffer[sVar3] + 0x16) < 0xfe) {
        sVar3 = sVar3 + 1;
      }
      else {
        uVar11 = (int)sVar3 + now_pos;
        uVar4 = uVar11 - uVar9;
        uVar7 = 0;
        if (uVar4 < 6) {
          if (uVar11 == uVar9) {
            uVar7 = (ulong)uVar10;
          }
          else {
            iVar5 = uVar4 + (uVar4 == 0);
            uVar7 = (ulong)uVar10;
            do {
              uVar7 = (ulong)(((uint)uVar7 & 0x77) * 2);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
        }
        uVar10 = 1;
        uVar4 = (uint)uVar7;
        uVar9 = uVar11;
        if ((byte)(buffer[sVar3 + 4] + 1) < 2) {
          uVar10 = 0x11;
          if ((x86_code::MASK_TO_ALLOWED_STATUS[(uint)(uVar7 >> 1) & 7] == true) && (uVar4 < 0x20))
          {
            uVar10 = (uint)buffer[sVar3 + 1] |
                     (uint)buffer[sVar3 + 2] << 8 |
                     (uint)buffer[sVar3 + 3] << 0x10 | (uint)buffer[sVar3 + 4] << 0x18;
            iVar5 = -5 - uVar11;
            if (is_encoder) {
              iVar5 = uVar11 + 5;
            }
            do {
              uVar1 = uVar10 + iVar5;
              if (uVar4 == 0) {
LAB_00549de8:
                bVar2 = false;
              }
              else {
                cVar8 = (char)(x86_code::MASK_TO_BIT_NUMBER[uVar7 >> 1] << 3);
                uVar6 = uVar1 >> (0x18U - cVar8 & 0x1f);
                if (((char)uVar6 != -1) && ((uVar6 & 0xff) != 0)) goto LAB_00549de8;
                uVar10 = ~(-1 << (-cVar8 & 0x1fU) ^ uVar1);
                bVar2 = true;
              }
            } while (bVar2);
            buffer[sVar3 + 4] = (uint8_t)((int)(uVar1 * 0x80) >> 0x1f);
            buffer[sVar3 + 3] = (uint8_t)(uVar1 >> 0x10);
            buffer[sVar3 + 2] = (uint8_t)(uVar1 >> 8);
            buffer[sVar3 + 1] = (uint8_t)uVar1;
            sVar3 = sVar3 + 5;
            uVar10 = 0;
            goto LAB_00549e21;
          }
        }
        sVar3 = sVar3 + 1;
        uVar10 = uVar10 | uVar4;
      }
LAB_00549e21:
    } while (sVar3 <= size - 5);
    simple->prev_mask = uVar10;
    simple->prev_pos = uVar9;
  }
  return sVar3;
}

Assistant:

static size_t
x86_code(lzma_simple *simple, uint32_t now_pos, bool is_encoder,
		uint8_t *buffer, size_t size)
{
	static const bool MASK_TO_ALLOWED_STATUS[8]
		= { true, true, true, false, true, false, false, false };

	static const uint32_t MASK_TO_BIT_NUMBER[8]
			= { 0, 1, 2, 2, 3, 3, 3, 3 };

	uint32_t prev_mask = simple->prev_mask;
	uint32_t prev_pos = simple->prev_pos;

	size_t limit;
	size_t buffer_pos;

	if (size < 5)
		return 0;

	if (now_pos - prev_pos > 5)
		prev_pos = now_pos - 5;

	limit = size - 5;
	buffer_pos = 0;

	while (buffer_pos <= limit) {
		uint32_t offset;
		uint32_t i;

		uint8_t b = buffer[buffer_pos];
		if (b != 0xE8 && b != 0xE9) {
			++buffer_pos;
			continue;
		}

		offset = now_pos + (uint32_t)(buffer_pos)
				- prev_pos;
		prev_pos = now_pos + (uint32_t)(buffer_pos);

		if (offset > 5) {
			prev_mask = 0;
		} else {
			for (i = 0; i < offset; ++i) {
				prev_mask &= 0x77;
				prev_mask <<= 1;
			}
		}

		b = buffer[buffer_pos + 4];

		if (Test86MSByte(b)
			&& MASK_TO_ALLOWED_STATUS[(prev_mask >> 1) & 0x7]
				&& (prev_mask >> 1) < 0x10) {

			uint32_t src = ((uint32_t)(b) << 24)
				| ((uint32_t)(buffer[buffer_pos + 3]) << 16)
				| ((uint32_t)(buffer[buffer_pos + 2]) << 8)
				| (buffer[buffer_pos + 1]);

			uint32_t dest;
			while (true) {
				uint32_t i;

				if (is_encoder)
					dest = src + (now_pos + (uint32_t)(
							buffer_pos) + 5);
				else
					dest = src - (now_pos + (uint32_t)(
							buffer_pos) + 5);

				if (prev_mask == 0)
					break;

				i = MASK_TO_BIT_NUMBER[prev_mask >> 1];

				b = (uint8_t)(dest >> (24 - i * 8));

				if (!Test86MSByte(b))
					break;

				src = dest ^ ((1u << (32 - i * 8)) - 1);
			}

			buffer[buffer_pos + 4]
					= (uint8_t)(~(((dest >> 24) & 1) - 1));
			buffer[buffer_pos + 3] = (uint8_t)(dest >> 16);
			buffer[buffer_pos + 2] = (uint8_t)(dest >> 8);
			buffer[buffer_pos + 1] = (uint8_t)(dest);
			buffer_pos += 5;
			prev_mask = 0;

		} else {
			++buffer_pos;
			prev_mask |= 1;
			if (Test86MSByte(b))
				prev_mask |= 0x10;
		}
	}

	simple->prev_mask = prev_mask;
	simple->prev_pos = prev_pos;

	return buffer_pos;
}